

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFloatConstant(Builder *this,float f,bool specConstant)

{
  Id IVar1;
  Instruction *this_00;
  mapped_type *this_01;
  key_type local_4c;
  value_type local_48;
  pointer local_40;
  Instruction *c;
  Op local_30;
  Id existing;
  uint value;
  anon_union_4_2_f9ecb22f u;
  Id typeId;
  Op opcode;
  bool specConstant_local;
  Builder *pBStack_18;
  float f_local;
  Builder *this_local;
  
  u.fl = 6.02558e-44;
  if (specConstant) {
    u.fl = 7.00649e-44;
  }
  typeId._3_1_ = specConstant;
  opcode = (Op)f;
  pBStack_18 = this;
  value = makeFloatType(this,0x20);
  existing = opcode;
  local_30 = opcode;
  if ((typeId._3_1_ & 1) == 0) {
    IVar1 = findScalarConstant(this,OpTypeFloat,u.ui,value,opcode);
    if (IVar1 != 0) {
      return IVar1;
    }
    c._4_4_ = 0;
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,value,u.ui);
  local_40 = this_00;
  spv::Instruction::addImmediateOperand(this_00,local_30);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
             local_40);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_48);
  local_4c = 0x16;
  this_01 = std::
            unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
            ::operator[](&this->groupedConstants,&local_4c);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_01,&local_40)
  ;
  Module::mapInstruction(&this->module,local_40);
  IVar1 = spv::Instruction::getResultId(local_40);
  return IVar1;
}

Assistant:

Id Builder::makeFloatConstant(float f, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(32);
    union { float fl; unsigned int ui; } u;
    u.fl = f;
    unsigned value = u.ui;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}